

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint uVar1;
  bool bVar2;
  type_conflict5 tVar3;
  long in_RDI;
  long in_R8;
  int *in_R9;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  int in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000018;
  long in_stack_00000020;
  cpp_dec_float<50U,_int,_void> *in_stack_00000028;
  uint in_stack_00000030;
  long in_stack_00000038;
  int *in_stack_00000040;
  int *in_stack_00000048;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000a0;
  int *rperm_2;
  int k_2;
  int j_2;
  int i_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_2;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffa38;
  cpp_dec_float<50U,_int,_void> *pcVar4;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffa40;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffaa8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffab0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffaf8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb08;
  undefined1 local_4cc [56];
  undefined1 local_494 [56];
  cpp_dec_float<50U,_int,_void> local_45c;
  undefined4 local_424 [15];
  long local_3e8;
  uint in_stack_fffffffffffffc20;
  uint in_stack_fffffffffffffc24;
  int local_3d8;
  int in_stack_fffffffffffffc2c;
  int *in_stack_fffffffffffffc30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc38;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc40;
  undefined4 local_39c;
  undefined1 local_398 [56];
  undefined1 local_360 [56];
  long local_328;
  int local_320;
  int local_31c;
  int local_318;
  undefined1 local_314 [56];
  undefined4 local_2dc;
  undefined1 local_2d8 [56];
  undefined1 local_2a0 [56];
  int *local_268;
  long local_260;
  int local_254;
  int local_250;
  int local_24c;
  undefined1 local_248 [36];
  int in_stack_fffffffffffffddc;
  int *in_stack_fffffffffffffde0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdf8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe08;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe10;
  undefined1 local_1d8 [56];
  int *local_1a0;
  long local_198;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined4 *local_158;
  long local_150;
  undefined4 *local_148;
  long local_140;
  undefined4 *local_138;
  long local_130;
  undefined1 *local_120;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d0;
  cpp_dec_float<50U,_int,_void> *local_c0;
  undefined1 *local_b0;
  undefined1 *local_a0;
  undefined1 *local_90;
  long local_88;
  undefined1 *local_80;
  long local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  long local_60;
  long local_58;
  undefined1 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffffd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  int *in_stack_fffffffffffffff0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffff8;
  
  local_120 = local_1d8;
  local_1a0 = in_R9;
  local_198 = in_R8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  local_110 = &stack0xfffffffffffffdf0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  this_00 = (cpp_dec_float<50U,_int,_void> *)&stack0x00000030;
  pcVar4 = in_stack_00000028;
  vSolveLright2(unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                rperm_1,_k_1,_i_1);
  if (in_stack_00000038 == 0) {
    local_168 = local_314;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
    local_328 = *(long *)(in_RDI + 0x130);
    local_31c = 0;
    for (local_318 = 0; local_318 < in_stack_00000008; local_318 = local_318 + 1) {
      local_320 = local_1a0[local_318];
      local_78 = local_198 + (long)local_320 * 0x38;
      local_70 = local_314;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      local_e0 = local_360;
      local_e8 = local_314;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      local_d0 = local_398;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      if (bVar2) {
        enQueueMax(local_1a0,&local_31c,*(int *)(local_328 + (long)local_320 * 4));
      }
      else {
        local_39c = 0;
        local_140 = local_198 + (long)local_320 * 0x38;
        local_148 = &local_39c;
        local_40 = local_148;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar4);
      }
    }
  }
  else {
    local_170 = local_248;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
    local_268 = in_stack_00000048;
    local_260 = *(long *)(in_RDI + 0x130);
    local_250 = 0;
    for (local_24c = 0; local_24c < in_stack_00000008; local_24c = local_24c + 1) {
      local_254 = local_1a0[local_24c];
      local_58 = local_198 + (long)local_254 * 0x38;
      local_50 = local_248;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      local_100 = local_2a0;
      local_108 = local_248;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      local_f0 = local_2d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      if (bVar2) {
        *local_268 = local_254;
        local_268 = local_268 + 1;
        enQueueMax(local_1a0,&local_250,*(int *)(local_260 + (long)local_254 * 4));
        local_60 = in_stack_00000038 + (long)local_254 * 0x38;
        local_68 = local_248;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      }
      else {
        local_2dc = 0;
        local_130 = local_198 + (long)local_254 * 0x38;
        local_138 = &local_2dc;
        local_48 = local_138;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar4);
      }
    }
    *in_stack_00000040 = local_250;
  }
  if ((double)(int)in_stack_00000030 <= (double)*(int *)(in_RDI + 4) * 0.2) {
    local_160 = &stack0xfffffffffffffc2c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
    local_3e8 = *(long *)(in_RDI + 0x130);
    in_stack_fffffffffffffc24 = 0;
    for (local_3d8 = 0; uVar1 = in_stack_fffffffffffffc24, local_3d8 < (int)in_stack_00000030;
        local_3d8 = local_3d8 + 1) {
      in_stack_fffffffffffffc20 = (in_stack_00000028->data)._M_elems[local_3d8];
      local_88 = in_stack_00000020 + (long)(int)in_stack_fffffffffffffc20 * 0x38;
      local_80 = &stack0xfffffffffffffc2c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,in_stack_00000018);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(this_00);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar4,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x361a7d);
      if (tVar3) {
        enQueueMax((int *)in_stack_00000028,(int *)&stack0xfffffffffffffc24,
                   *(int *)(local_3e8 + (long)(int)in_stack_fffffffffffffc20 * 4));
      }
      else {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar4,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x361ac5);
        if (tVar3) {
          enQueueMax((int *)in_stack_00000028,(int *)&stack0xfffffffffffffc24,
                     *(int *)(local_3e8 + (long)(int)in_stack_fffffffffffffc20 * 4));
        }
        else {
          local_424[0] = 0;
          local_150 = in_stack_00000020 + (long)(int)in_stack_fffffffffffffc20 * 0x38;
          local_158 = local_424;
          local_38 = local_158;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (this_00,(long_long_type)pcVar4);
        }
      }
    }
  }
  else {
    (in_stack_00000028->data)._M_elems[0] = *(int *)(in_RDI + 4) - 1;
    uVar1 = in_stack_00000030;
  }
  in_stack_00000030 = uVar1;
  local_c0 = &local_45c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
  pcVar4 = &local_45c;
  in_stack_00000008 =
       vSolveUright(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                    (int *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                    in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                    in_stack_000000a0);
  local_b0 = local_494;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
  vSolveUrightNoNZ(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffffe00,(int *)in_stack_fffffffffffffdf8,
                   in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
  if (*(int *)(in_RDI + 400) == 0) {
    local_a0 = local_4cc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
    in_stack_00000008 =
         vSolveUpdateRight(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                           in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    local_90 = &stack0xfffffffffffffafc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
    vSolveUpdateRightNoNZ
              (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  }
  return in_stack_00000008;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}